

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void duckdb::PrintPhaseTimingsToStream(ostream *ss,ProfilingInfo *info,idx_t width)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  key_type *pkVar3;
  ostream *ss_00;
  idx_t width_00;
  bool bVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  _Alloc_hider _Var7;
  _Hash_node_base *p_Var8;
  string metric;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  physical_planner_head;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  planner_head;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  optimizer_head;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  physical_planner_timings;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  planner_timings;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  optimizer_timings;
  allocator local_219;
  mapped_type local_218;
  key_type local_210;
  mapped_type local_1f0;
  key_type local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  ostream *local_148;
  idx_t local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
  local_e8.first._M_string_length = 0;
  local_e8.first.field_2._M_local_buf[0] = '\0';
  local_e8.second = 0.0;
  local_110.first._M_dataplus._M_p = (pointer)&local_110.first.field_2;
  local_110.first._M_string_length = 0;
  local_110.first.field_2._M_local_buf[0] = '\0';
  local_110.second = 0.0;
  local_138.first._M_dataplus._M_p = (pointer)&local_138.first.field_2;
  local_138.first._M_string_length = 0;
  local_138.first.field_2._M_local_buf[0] = '\0';
  local_138.second = 0.0;
  p_Var8 = (info->metrics)._M_h._M_before_begin._M_nxt;
  local_148 = ss;
  local_140 = width;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    paVar1 = &local_210.field_2;
    do {
      bVar4 = MetricsUtils::IsOptimizerMetric(*(MetricsType *)&p_Var8[1]._M_nxt);
      if (bVar4) {
        local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
        pcVar5 = EnumUtil::ToChars<duckdb::MetricsType>(*(MetricsType *)&p_Var8[1]._M_nxt);
        ::std::__cxx11::string::string((string *)&local_1e8,pcVar5,&local_219);
        ::std::__cxx11::string::substr((ulong)&local_210,(ulong)&local_1e8);
        pmVar6 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)&local_60,&local_210);
        *pmVar6 = local_218;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        _Var7._M_p = local_1e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) goto switchD_004e87a0_caseD_11;
LAB_004e8b1e:
        operator_delete(_Var7._M_p);
      }
      else {
        bVar4 = MetricsUtils::IsPhaseTimingMetric(*(MetricsType *)&p_Var8[1]._M_nxt);
        if (bVar4) {
          switch(*(undefined1 *)&p_Var8[1]._M_nxt) {
          case 0x10:
            local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
            local_210._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Optimizer","");
            local_1f0 = local_218;
            ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_210);
            local_e8.second = local_1f0;
            break;
          case 0x11:
            goto switchD_004e87a0_caseD_11;
          case 0x12:
            local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
            local_210._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Planner","");
            local_1f0 = local_218;
            ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_210);
            local_110.second = local_1f0;
            break;
          default:
            goto switchD_004e87a0_caseD_13;
          case 0x14:
            local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
            local_210._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_210,"Physical Planner","");
            local_1f0 = local_218;
            ::std::__cxx11::string::operator=((string *)&local_138,(string *)&local_210);
            local_138.second = local_1f0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar1) {
            operator_delete(local_210._M_dataplus._M_p);
          }
switchD_004e87a0_caseD_13:
          pcVar5 = EnumUtil::ToChars<duckdb::MetricsType>(*(MetricsType *)&p_Var8[1]._M_nxt);
          ::std::__cxx11::string::string((string *)&local_210,pcVar5,(allocator *)&local_1e8);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_210._M_dataplus._M_p,
                     local_210._M_dataplus._M_p + local_210._M_string_length);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"PHYSICAL_PLANNER","");
          bVar4 = StringUtil::StartsWith(&local_1a8,&local_168);
          if (bVar4) {
            cVar2 = *(char *)&p_Var8[1]._M_nxt;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p);
            }
            if (cVar2 == '\x14') goto LAB_004e89f7;
            local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
            ::std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_210);
            pmVar6 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)&local_c0,&local_1e8);
LAB_004e8ad0:
            *pmVar6 = local_218;
            pkVar3 = &local_1e8;
            _Var7._M_p = local_1e8._M_dataplus._M_p;
LAB_004e8b0a:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var7._M_p != &pkVar3->field_2) {
              operator_delete(_Var7._M_p);
            }
          }
          else {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p);
            }
LAB_004e89f7:
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,local_210._M_dataplus._M_p,
                       local_210._M_dataplus._M_p + local_210._M_string_length);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"PLANNER","");
            bVar4 = StringUtil::StartsWith(&local_1c8,&local_188);
            if (!bVar4) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p);
              }
              pkVar3 = &local_1c8;
              _Var7._M_p = local_1c8._M_dataplus._M_p;
              goto LAB_004e8b0a;
            }
            cVar2 = *(char *)&p_Var8[1]._M_nxt;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
            if (cVar2 != '\x12') {
              local_218 = Value::GetValue<double>((Value *)(p_Var8 + 2));
              ::std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_210);
              pmVar6 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                     *)&local_90,&local_1e8);
              goto LAB_004e8ad0;
            }
          }
          _Var7._M_p = local_210._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar1) goto LAB_004e8b1e;
        }
      }
switchD_004e87a0_caseD_11:
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  width_00 = local_140;
  ss_00 = local_148;
  RenderPhaseTimings(local_148,&local_e8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&local_60,local_140);
  RenderPhaseTimings(ss_00,&local_138,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&local_c0,width_00);
  RenderPhaseTimings(ss_00,&local_110,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&local_90,width_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
    operator_delete(local_138.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
    operator_delete(local_110.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
    operator_delete(local_e8.first._M_dataplus._M_p);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_c0);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_90);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PrintPhaseTimingsToStream(std::ostream &ss, const ProfilingInfo &info, idx_t width) {
	map<string, double> optimizer_timings;
	map<string, double> planner_timings;
	map<string, double> physical_planner_timings;

	pair<string, double> optimizer_head;
	pair<string, double> planner_head;
	pair<string, double> physical_planner_head;

	for (const auto &entry : info.metrics) {
		if (MetricsUtils::IsOptimizerMetric(entry.first)) {
			optimizer_timings[EnumUtil::ToString(entry.first).substr(10)] = entry.second.GetValue<double>();
		} else if (MetricsUtils::IsPhaseTimingMetric(entry.first)) {
			switch (entry.first) {
			case MetricsType::CUMULATIVE_OPTIMIZER_TIMING:
				continue;
			case MetricsType::ALL_OPTIMIZERS:
				optimizer_head = {"Optimizer", entry.second.GetValue<double>()};
				break;
			case MetricsType::PHYSICAL_PLANNER:
				physical_planner_head = {"Physical Planner", entry.second.GetValue<double>()};
				break;
			case MetricsType::PLANNER:
				planner_head = {"Planner", entry.second.GetValue<double>()};
				break;
			default:
				break;
			}

			auto metric = EnumUtil::ToString(entry.first);
			if (StringUtil::StartsWith(metric, "PHYSICAL_PLANNER") && entry.first != MetricsType::PHYSICAL_PLANNER) {
				physical_planner_timings[metric.substr(17)] = entry.second.GetValue<double>();
			} else if (StringUtil::StartsWith(metric, "PLANNER") && entry.first != MetricsType::PLANNER) {
				planner_timings[metric.substr(8)] = entry.second.GetValue<double>();
			}
		}
	}

	RenderPhaseTimings(ss, optimizer_head, optimizer_timings, width);
	RenderPhaseTimings(ss, physical_planner_head, physical_planner_timings, width);
	RenderPhaseTimings(ss, planner_head, planner_timings, width);
}